

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::parsing::Token>::emplaceRealloc<slang::parsing::Token_const&>
          (SmallVectorBase<slang::parsing::Token> *this,pointer pos,Token *args)

{
  ulong uVar1;
  undefined8 *puVar2;
  Info *pIVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  pointer pTVar7;
  pointer pTVar8;
  size_type sVar9;
  pointer pTVar10;
  long lVar11;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar1 = this->cap;
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar11 = (long)pos - (long)this->data_;
  pTVar7 = (pointer)detail::allocArray(capacity,0x10);
  pIVar3 = args->info;
  *(undefined8 *)((long)pTVar7 + lVar11) = *(undefined8 *)args;
  ((undefined8 *)((long)pTVar7 + lVar11))[1] = pIVar3;
  pTVar8 = this->data_;
  sVar9 = this->len;
  if (pTVar8 + sVar9 == pos) {
    pTVar10 = pTVar7;
    if (sVar9 != 0) {
      do {
        uVar4 = pTVar8->field_0x2;
        NVar5.raw = (pTVar8->numFlags).raw;
        uVar6 = pTVar8->rawLen;
        pIVar3 = pTVar8->info;
        pTVar10->kind = pTVar8->kind;
        pTVar10->field_0x2 = uVar4;
        pTVar10->numFlags = (NumericTokenFlags)NVar5.raw;
        pTVar10->rawLen = uVar6;
        pTVar10->info = pIVar3;
        pTVar8 = pTVar8 + 1;
        pTVar10 = pTVar10 + 1;
      } while (pTVar8 != pos);
    }
  }
  else {
    pTVar10 = pTVar7;
    if (pTVar8 != pos) {
      do {
        uVar4 = pTVar8->field_0x2;
        NVar5.raw = (pTVar8->numFlags).raw;
        uVar6 = pTVar8->rawLen;
        pIVar3 = pTVar8->info;
        pTVar10->kind = pTVar8->kind;
        pTVar10->field_0x2 = uVar4;
        pTVar10->numFlags = (NumericTokenFlags)NVar5.raw;
        pTVar10->rawLen = uVar6;
        pTVar10->info = pIVar3;
        pTVar8 = pTVar8 + 1;
        pTVar10 = pTVar10 + 1;
      } while (pTVar8 != pos);
      pTVar8 = this->data_;
      sVar9 = this->len;
    }
    if (pTVar8 + sVar9 != pos) {
      puVar2 = (undefined8 *)((long)pTVar7 + lVar11);
      do {
        pIVar3 = pos->info;
        puVar2[2] = *(undefined8 *)pos;
        puVar2[3] = pIVar3;
        pos = pos + 1;
        puVar2 = puVar2 + 2;
      } while (pos != pTVar8 + sVar9);
    }
  }
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
  }
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pTVar7;
  return (pointer)((long)pTVar7 + lVar11);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}